

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_24(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RCX;
  char *pcVar5;
  char *pcVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  QPDFObjectHandle res1;
  QPDFObjectHandle res2;
  undefined1 local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  QPDFObjectHandle array2;
  QPDFObjectHandle array1;
  QPDFObjectHandle trailer;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  string local_40 [32];
  
  QPDFObjectHandle::newReserved((QPDF *)&res1);
  QPDFObjectHandle::newReserved((QPDF *)&res2);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&array1,"Array1",(allocator<char> *)&array2);
  QPDFObjectHandle::replaceKey((string *)&trailer,&array1);
  std::__cxx11::string::~string((string *)&array1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&array1,"Array2",(allocator<char> *)&array2);
  QPDFObjectHandle::replaceKey((string *)&trailer,&array1);
  std::__cxx11::string::~string((string *)&array1);
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::appendItem(&array1);
  QPDFObjectHandle::newInteger((longlong)&w);
  QPDFObjectHandle::appendItem(&array1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  QPDFObjectHandle::appendItem(&array2);
  QPDFObjectHandle::newInteger((longlong)&w);
  QPDFObjectHandle::appendItem(&array2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 != '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"oops -- res1 is an array");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  cVar1 = QPDFObjectHandle::isReserved();
  if (cVar1 != '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"res1 is still reserved after checking if array")
    ;
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&res1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&array1);
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RCX._M_pi;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_60;
  QPDF::replaceReserved(QVar7,QVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  cVar1 = QPDFObjectHandle::isReserved();
  pcVar5 = "oops -- res1 is still reserved";
  pcVar6 = "res1 is no longer reserved";
  if (cVar1 != '\0') {
    pcVar6 = "oops -- res1 is still reserved";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  QPDFObjectHandle::assertArray();
  poVar4 = std::operator<<((ostream *)&std::cout,"res1 is an array");
  std::endl<char,std::char_traits<char>>(poVar4);
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  std::__cxx11::string::~string(local_40);
  poVar4 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::endl<char,std::char_traits<char>>(poVar4);
  QPDFObjectHandle::makeDirect(SUB81(&res2,0));
  poVar4 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_70,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&res2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&array2);
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar5;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_80;
  QPDF::replaceReserved(QVar8,QVar10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  QPDFObjectHandle::assertArray();
  poVar4 = std::operator<<((ostream *)&std::cout,"res2 is an array");
  std::endl<char,std::char_traits<char>>(poVar4);
  QPDFObjectHandle::getArrayItem((int)local_d0);
  QPDFObjectHandle::getArrayItem((int)&w);
  iVar2 = QPDFObjectHandle::getIntValueAsInt();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  QPDFObjectHandle::getArrayItem((int)local_d0);
  QPDFObjectHandle::getArrayItem((int)&w);
  iVar3 = QPDFObjectHandle::getIntValueAsInt();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  if (iVar3 == 1 && iVar2 == 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"circular access and lazy resolution worked");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setStaticID(false);
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&array2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&array1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_24(QPDF& pdf, char const* arg2)
{
    // Test behavior of reserved objects
    QPDFObjectHandle res1 = QPDFObjectHandle::newReserved(&pdf);
    QPDFObjectHandle res2 = QPDFObjectHandle::newReserved(&pdf);
    QPDFObjectHandle trailer = pdf.getTrailer();
    trailer.replaceKey("Array1", res1);
    trailer.replaceKey("Array2", res2);

    QPDFObjectHandle array1 = QPDFObjectHandle::newArray();
    QPDFObjectHandle array2 = QPDFObjectHandle::newArray();
    array1.appendItem(res2);
    array1.appendItem(QPDFObjectHandle::newInteger(1));
    array2.appendItem(res1);
    array2.appendItem(QPDFObjectHandle::newInteger(2));
    // Make sure trying to ask questions about a reserved object
    // doesn't break it.
    if (res1.isArray()) {
        std::cout << "oops -- res1 is an array" << std::endl;
    }
    if (res1.isReserved()) {
        std::cout << "res1 is still reserved after checking if array" << std::endl;
    }
    pdf.replaceReserved(res1, array1);
    if (res1.isReserved()) {
        std::cout << "oops -- res1 is still reserved" << std::endl;
    } else {
        std::cout << "res1 is no longer reserved" << std::endl;
    }
    res1.assertArray();
    std::cout << "res1 is an array" << std::endl;

    try {
        res2.unparseResolved();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
    try {
        res2.makeDirect();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    pdf.replaceReserved(res2, array2);

    res2.assertArray();
    std::cout << "res2 is an array" << std::endl;

    // Verify that the previously added reserved keys can be
    // dereferenced properly now
    int i1 = res1.getArrayItem(0).getArrayItem(1).getIntValueAsInt();
    int i2 = res2.getArrayItem(0).getArrayItem(1).getIntValueAsInt();
    if ((i1 == 2) && (i2 == 1)) {
        std::cout << "circular access and lazy resolution worked" << std::endl;
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}